

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_printResetWithNegativeOrder_Test::~Reset_printResetWithNegativeOrder_Test
          (Reset_printResetWithNegativeOrder_Test *this)

{
  Reset_printResetWithNegativeOrder_Test *this_local;
  
  ~Reset_printResetWithNegativeOrder_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, printResetWithNegativeOrder)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset order=\"-1\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ResetPtr r = libcellml::Reset::create();

    r->setOrder(-1);
    c->addReset(r);

    libcellml::PrinterPtr p = libcellml::Printer::create();

    const std::string a = p->printModel(m);
    EXPECT_EQ(e, a);
}